

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFA.hpp
# Opt level: O0

bool __thiscall
Centaurus::DFA<char>::run
          (DFA<char> *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *seq,
          int index,int input_pos)

{
  bool bVar1;
  int index_00;
  const_reference this_00;
  long lVar2;
  vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_> *this_01;
  reference this_02;
  CharClass<char> *this_03;
  char *pcVar3;
  NFATransition<char> *tr;
  const_iterator __end0;
  const_iterator __begin0;
  vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_> *__range3
  ;
  DFAState<char> *state;
  int input_pos_local;
  int index_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *seq_local;
  DFA<char> *this_local;
  
  this_00 = std::vector<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_>::
            operator[](&(this->super_NFABase<Centaurus::DFAState<char>_>).m_states,(long)index);
  lVar2 = std::__cxx11::string::size();
  if (input_pos == lVar2) {
    this_local._7_1_ = DFAState<char>::is_accept(this_00);
  }
  else {
    this_01 = NFABaseState<char,_Centaurus::IndexVector>::get_transitions
                        (&this_00->super_NFABaseState<char,_Centaurus::IndexVector>);
    __end0 = std::
             vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
             ::begin(this_01);
    tr = (NFATransition<char> *)
         std::
         vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>::
         end(this_01);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end0,(__normal_iterator<const_Centaurus::NFATransition<char>_*,_std::vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>_>
                                       *)&tr), bVar1) {
      this_02 = __gnu_cxx::
                __normal_iterator<const_Centaurus::NFATransition<char>_*,_std::vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>_>
                ::operator*(&__end0);
      this_03 = NFATransition<char>::label(this_02);
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)seq);
      bVar1 = CharClass<char>::includes(this_03,*pcVar3);
      if (bVar1) {
        index_00 = NFATransition<char>::dest(this_02);
        bVar1 = run(this,seq,index_00,input_pos + 1);
        return bVar1;
      }
      __gnu_cxx::
      __normal_iterator<const_Centaurus::NFATransition<char>_*,_std::vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>_>
      ::operator++(&__end0);
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool run(const std::basic_string<TCHAR>& seq, int index = 0, int input_pos = 0) const
	{
		const DFAState<TCHAR>& state = m_states[index];
		if (input_pos == seq.size())
		{
			return state.is_accept();
		}
		else
		{
			for (const auto& tr : state.get_transitions())
			{
				if (tr.label().includes(seq[input_pos]))
				{
					return run(seq, tr.dest(), input_pos + 1);
				}
			}
			return false;
		}
	}